

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Driver.c
# Opt level: O3

DdManager * Llb_DriverLastPartition(Aig_Man_t *p,Vec_Int_t *vVarsNs,abctime TimeTarget)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  int iVar3;
  DdManager *unique;
  DdNode *pDVar4;
  DdNode *pDVar5;
  ulong uVar6;
  int *piVar7;
  DdNode *f;
  long lVar8;
  
  unique = Cudd_Init(p->vObjs->nSize,0,0x100,0x40000,0);
  Cudd_AutodynEnable(unique,CUDD_REORDER_SYMM_SIFT);
  unique->TimeStop = TimeTarget;
  pDVar4 = Cudd_ReadOne(unique);
  Cudd_Ref(pDVar4);
  iVar3 = vVarsNs->nSize;
  if (0 < iVar3) {
    lVar8 = 0;
    f = pDVar4;
    do {
      pVVar2 = p->vObjs;
      if (pVVar2 == (Vec_Ptr_t *)0x0) {
        piVar7 = (int *)0x0;
      }
      else {
        uVar1 = vVarsNs->pArray[lVar8];
        if (((int)uVar1 < 0) || (pVVar2->nSize <= (int)uVar1)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        piVar7 = (int *)pVVar2->pArray[uVar1];
      }
      pDVar4 = f;
      if (((piVar7[6] & 7U) == 3) && (p->nTruePos <= *piVar7)) {
        pDVar4 = Cudd_bddIthVar(unique,piVar7[9]);
        if (*(ulong *)(piVar7 + 2) == 0) {
          iVar3 = -1;
        }
        else {
          iVar3 = *(int *)((*(ulong *)(piVar7 + 2) & 0xfffffffffffffffe) + 0x24);
        }
        pDVar5 = Cudd_bddIthVar(unique,iVar3);
        uVar6 = *(ulong *)(piVar7 + 2);
        if ((*(uint *)((uVar6 & 0xfffffffffffffffe) + 0x18) & 7) == 1) {
          pDVar5 = Cudd_ReadOne(unique);
          uVar6 = *(ulong *)(piVar7 + 2);
        }
        pDVar5 = Cudd_bddXnor(unique,pDVar4,(DdNode *)((ulong)((uint)uVar6 & 1) ^ (ulong)pDVar5));
        Cudd_Ref(pDVar5);
        pDVar4 = Cudd_bddAnd(unique,f,pDVar5);
        if (pDVar4 == (DdNode *)0x0) {
          Cudd_RecursiveDeref(unique,f);
          Cudd_RecursiveDeref(unique,pDVar5);
          return (DdManager *)0x0;
        }
        Cudd_Ref(pDVar4);
        Cudd_RecursiveDeref(unique,f);
        Cudd_RecursiveDeref(unique,pDVar5);
        iVar3 = vVarsNs->nSize;
      }
      lVar8 = lVar8 + 1;
      f = pDVar4;
    } while (lVar8 < iVar3);
  }
  Cudd_AutodynDisable(unique);
  unique->bFunc = pDVar4;
  unique->TimeStop = 0;
  return unique;
}

Assistant:

DdManager * Llb_DriverLastPartition( Aig_Man_t * p, Vec_Int_t * vVarsNs, abctime TimeTarget )
{
//    int fVerbose = 1;
    DdManager * dd;
    DdNode * bVar1, * bVar2, * bProd, * bRes, * bTemp;
    Aig_Obj_t * pObj;
    int i;
    dd = Cudd_Init( Aig_ManObjNumMax(p), 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    Cudd_AutodynEnable( dd, CUDD_REORDER_SYMM_SIFT );
    dd->TimeStop = TimeTarget;
    bRes = Cudd_ReadOne(dd);                                   Cudd_Ref( bRes );

    // mark the duplicated flop inputs
    Aig_ManForEachObjVec( vVarsNs, p, pObj, i )
    {
        if ( !Saig_ObjIsLi(p, pObj) )
            continue;
        bVar1 = Cudd_bddIthVar( dd, Aig_ObjId(pObj) );
        bVar2 = Cudd_bddIthVar( dd, Aig_ObjFaninId0(pObj) );
        if ( Aig_ObjIsConst1(Aig_ObjFanin0(pObj)) )
            bVar2 = Cudd_ReadOne(dd);
        bVar2 = Cudd_NotCond( bVar2, Aig_ObjFaninC0(pObj) );
        bProd = Cudd_bddXnor( dd, bVar1, bVar2 );              Cudd_Ref( bProd );
//        bRes  = Cudd_bddAnd( dd, bTemp = bRes, bProd );        Cudd_Ref( bRes );
//        bRes  = Extra_bddAndTime( dd, bTemp = bRes, bProd, TimeTarget );  
        bRes  = Cudd_bddAnd( dd, bTemp = bRes, bProd );  
        if ( bRes == NULL )
        {
            Cudd_RecursiveDeref( dd, bTemp );
            Cudd_RecursiveDeref( dd, bProd );
            return NULL;
        }        
        Cudd_Ref( bRes );
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bProd );
    }

/*
    Saig_ManForEachLi( p, pObj, i )
        printf( "%d ", Aig_ObjId(pObj) );
    printf( "\n" );
    Saig_ManForEachLi( p, pObj, i )
        printf( "%c%d ", Aig_ObjFaninC0(pObj)? '-':'+', Aig_ObjFaninId0(pObj) );
    printf( "\n" );
*/
    Cudd_AutodynDisable( dd );
//    Cudd_RecursiveDeref( dd, bRes );
//    Extra_StopManager( dd );
    dd->bFunc = bRes;
    dd->TimeStop = 0;
    return dd;
}